

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_parser(lws *wsi,uchar *in,lws_filepos_t _inlen,lws_filepos_t *inused)

{
  int32_t *piVar1;
  undefined1 *puVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  lws_h2_netconn *plVar6;
  lws_h2_netconn *plVar7;
  lws *plVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  lws_h2_protocol_send *plVar13;
  lws *plVar14;
  char *pcVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  uint32_t uVar19;
  byte *pbVar20;
  byte *pbVar21;
  ulong uVar22;
  byte *pbVar23;
  bool bVar24;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar26;
  undefined8 uVar25;
  char local_58 [40];
  
  plVar6 = (wsi->h2).h2n;
  if (plVar6 == (lws_h2_netconn *)0x0) {
    iVar11 = 1;
    pbVar23 = in;
LAB_001243c0:
    *inused = (long)pbVar23 - (long)in;
    return iVar11;
  }
  pbVar20 = in + _inlen;
  pbVar21 = in;
LAB_00122faf:
  while( true ) {
    uVar26 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (pbVar20 <= pbVar21) {
      iVar11 = 0;
      pbVar23 = pbVar21;
      goto LAB_001243c0;
    }
    pbVar23 = pbVar21 + 1;
    bVar9 = *pbVar21;
    uVar22 = (ulong)bVar9;
    sVar4 = (short)wsi->wsistate;
    uVar18 = (uint)bVar9;
    if (((sVar4 == 0x10f) || (sVar4 == 0x119)) || (sVar4 == 0x30d)) break;
    if (sVar4 == 0x20c) {
      uVar17 = plVar6->count;
      uVar10 = uVar17 + 1;
      plVar6->count = uVar10;
      if ((int)"PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar17] != uVar18) goto LAB_001243b3;
      pbVar21 = pbVar23;
      if ("PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar10] == '\0') {
        pcVar12 = lws_wsi_tag(wsi);
        _lws_log(8,"http2: %s: established\n",pcVar12);
        lwsi_set_state(wsi,0x30d);
        lws_validity_confirmed(wsi);
        plVar6->count = 0;
        (wsi->txc).tx_cr = 0xffff;
        plVar13 = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
        if (plVar13 == (lws_h2_protocol_send *)0x0) goto LAB_001243b3;
        lws_pps_schedule(wsi,plVar13);
      }
    }
    else {
      pbVar21 = pbVar23;
      if (plVar6->type == '\n') {
        plVar6->count = plVar6->count + 1;
      }
    }
  }
  bVar3 = plVar6->frame_state;
  if (bVar3 == 9) {
    uVar17 = plVar6->count;
    uVar10 = uVar17 + 1;
    plVar6->count = uVar10;
    uVar25 = in_stack_ffffffffffffff58;
    if (plVar6->type == '\n') goto switchD_001232ea_caseD_5;
    bVar3 = plVar6->flags;
    if (((bVar3 & 8) != 0) && ((*(ushort *)&plVar6->field_0xa8 & 0x40) == 0)) {
      plVar6->padding = bVar9;
      *(ushort *)&plVar6->field_0xa8 = *(ushort *)&plVar6->field_0xa8 | 0x40;
      plVar6->preamble = plVar6->preamble + 1;
      pbVar21 = pbVar23;
      if (plVar6->length - 1 < uVar18) {
        pcVar12 = "execssive padding";
LAB_001232bf:
        lws_h2_goaway(wsi,1,pcVar12);
        pbVar21 = pbVar23;
      }
      goto LAB_00122faf;
    }
    if (((bVar3 & 0x20) != 0) && ((plVar6->field_0xa8 & 0x80) == 0)) {
      _lws_log(0x10,"PRIORITY FLAG:  0x%x\n",uVar22);
      uVar19 = plVar6->preamble;
      plVar6->preamble = uVar19 + 1;
      if (uVar19 - ((*(ushort *)&plVar6->field_0xa8 >> 6 & 1) != 0) < 4) {
        plVar6->dep = plVar6->dep << 8 | uVar18;
        pbVar21 = pbVar23;
      }
      else {
        plVar6->weight_temp = bVar9;
        *(ushort *)&plVar6->field_0xa8 = *(ushort *)&plVar6->field_0xa8 | 0x80;
        _lws_log(0x10,"PRI FL: dep 0x%x, weight 0x%02X\n",(ulong)plVar6->dep,uVar22);
        pbVar21 = pbVar23;
      }
      goto LAB_00122faf;
    }
    if ((plVar6->padding != 0) && (plVar6->length - (uint)plVar6->padding < uVar10)) {
      if (bVar9 != 0) {
        pcVar12 = "nonzero padding";
        goto LAB_001232bf;
      }
      goto switchD_001232ea_caseD_5;
    }
    switch(plVar6->type) {
    case '\0':
      if (wsi->immortal_substream_count == '\0') {
        iVar11 = ((wsi->a).vhost)->keepalive_timeout;
        if (iVar11 == 0) {
          iVar11 = 0x1f;
        }
        lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar11);
      }
      if (plVar6->swsi == (lws *)0x0) goto LAB_001230b8;
      sVar16 = lws_buflist_next_segment_len(&plVar6->swsi->buflist,(uint8_t **)0x0);
      if (sVar16 != 0) {
        _lws_log(8,"%s: substream has pending\n","lws_h2_parser");
      }
      plVar14 = plVar6->swsi;
      if ((plVar14->role_ops == &role_ops_h1 || plVar14->role_ops == &role_ops_h2) &&
         ((short)plVar14->wsistate == 0x119)) {
        lwsi_set_state(plVar14,0x17);
        pcVar12 = lws_wsi_tag(plVar6->swsi);
        _lws_log(8,"%s: %s to LRS_BODY\n","lws_h2_parser",pcVar12);
        plVar14 = plVar6->swsi;
      }
      iVar11 = lws_hdr_total_length(plVar14,WSI_TOKEN_HTTP_CONTENT_LENGTH);
      if ((((iVar11 != 0) && ((plVar6->swsi->http).rx_content_length != 0)) &&
          ((byte *)(plVar6->swsi->http).rx_content_remain < pbVar20 + (-8 - (long)pbVar23))) &&
         (uVar25 = 0, plVar6->inside < plVar6->length)) {
        _lws_log(2,"%s: %lu %lu %lu %lu\n","lws_h2_parser");
        lws_h2_goaway(wsi,1,"More rx than content_length told");
        break;
      }
      iVar11 = (int)pbVar20 - (int)pbVar23;
      uVar18 = (plVar6->length - plVar6->count) + 1;
      if (iVar11 < (int)uVar18) {
        uVar18 = iVar11 + 1;
LAB_001239c3:
        plVar14 = plVar6->swsi;
        uVar22 = (ulong)uVar18;
        if ((*(ulong *)&plVar14->field_0x46e >> 0x3b & 1) == 0) {
          if ((short)plVar14->wsistate == 0x110) {
            iVar11 = lws_buflist_append_segment(&plVar14->buflist,pbVar21,uVar22);
            if (iVar11 < 0) {
              return -1;
            }
            plVar6->inside = plVar6->inside + uVar18;
            uVar22 = (ulong)(int)(uVar18 - 1);
            plVar6->count = plVar6->count + (uVar18 - 1);
            _lws_log(0x10,"%s: deferred %d\n","lws_h2_parser",(ulong)uVar18);
            plVar14 = plVar6->swsi;
          }
          else {
            *(ulong *)&plVar14->field_0x46e = *(ulong *)&plVar14->field_0x46e | 0x400000000000;
            uVar18 = lws_read_h1(plVar6->swsi,pbVar21,uVar22);
            puVar2 = &plVar6->swsi->field_0x46e;
            *(ulong *)puVar2 = *(ulong *)puVar2 & 0xffffbfffffffffff;
            if (((int)uVar18 < 0) ||
               (((uVar18 == 0 && (((plVar6->swsi->http).field_0x90 & 4) != 0)) &&
                (sVar16 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0), sVar16 == 0))
               )) {
              _lws_log(8,"%s: lws_read_h1 told %d %u / %u\n","lws_h2_parser",(ulong)uVar18,
                       (ulong)plVar6->count,(ulong)plVar6->length);
              uVar19 = plVar6->length;
              pbVar23 = pbVar23 + (uVar19 - plVar6->count);
              plVar6->inside = uVar19;
              plVar6->count = uVar19 - 1;
              goto LAB_00124438;
            }
            _lws_log(8,"%s: lws_read_h1 telling %d %u / %u\n","lws_h2_parser",(ulong)uVar18,
                     (ulong)plVar6->count,(ulong)plVar6->length);
            plVar6->inside = plVar6->inside + uVar18;
            uVar22 = (ulong)(uVar18 - 1);
            plVar6->count = plVar6->count + (uVar18 - 1);
            plVar14 = plVar6->swsi;
            piVar1 = &(plVar14->txc).peer_tx_cr_est;
            *piVar1 = *piVar1 - uVar18;
            piVar1 = &(wsi->txc).peer_tx_cr_est;
            *piVar1 = *piVar1 - uVar18;
          }
          pbVar23 = pbVar23 + uVar22;
          if ((plVar14->flags & 0x200) == 0) {
            if ((plVar14->txc).peer_tx_cr_est <= (int)uVar18) {
              lws_h2_update_peer_txcredit(plVar14,plVar6->sid,uVar18);
            }
          }
          else {
            lws_h2_update_peer_txcredit(wsi,0,uVar18);
            (plVar6->swsi->txc).manual = '\x01';
          }
          goto LAB_001230b8;
        }
        if ((plVar14->a).protocol == (lws_protocols *)0x0) {
          pcVar12 = lws_wsi_tag(plVar14);
          bVar24 = false;
          _lws_log(1,"%s: %p doesn\'t have protocol\n","lws_h2_parser",pcVar12);
        }
        else {
          piVar1 = &(plVar14->txc).peer_tx_cr_est;
          *piVar1 = *piVar1 - uVar18;
          piVar1 = &(wsi->txc).peer_tx_cr_est;
          *piVar1 = *piVar1 - uVar18;
          lws_wsi_txc_describe(&plVar14->txc,"lws_h2_parser",(plVar14->mux).my_sid);
          plVar14 = plVar6->swsi;
          iVar11 = user_callback_handle_rxflow
                             (((plVar14->a).protocol)->callback,plVar14,
                              LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,plVar14->user_space,pbVar21,
                              uVar22);
          bVar24 = iVar11 == 0;
        }
        pbVar23 = pbVar23 + (int)(uVar18 - 1);
        plVar6->inside = plVar6->inside + uVar18;
        plVar6->count = plVar6->count + (uVar18 - 1);
        if (bVar24) goto LAB_001230b8;
        _lws_log(8,"RECEIVE_CLIENT_HTTP closed it\n");
      }
      else if (plVar6->count <= plVar6->length) {
        _lws_log(0x10,"---- restricting len to %d \n",(ulong)uVar18);
        goto LAB_001239c3;
      }
LAB_00124438:
      lws_close_free_wsi(plVar6->swsi,LWS_CLOSE_STATUS_NOSTATUS,"close_swsi_and_return");
      plVar6->swsi = (lws *)0x0;
      plVar6->frame_state = '\0';
      plVar6->count = 0;
      iVar11 = 2;
      goto LAB_001243c0;
    case '\x01':
    case '\t':
      if (plVar6->swsi != (lws *)0x0) {
        iVar11 = lws_hpack_interpret(plVar6->swsi,bVar9);
        if (iVar11 == 0) goto LAB_001230b8;
        _lws_log(8,"%s: hpack failed\n","lws_h2_parser");
        goto LAB_001243b3;
      }
      break;
    case '\x02':
      if (4 < uVar10) {
        plVar6->weight_temp = bVar9;
        _lws_log(8,"PRIORITY: dep 0x%x, weight 0x%02X\n",(ulong)plVar6->dep,uVar22);
        if ((plVar6->dep & 0x7fffffff) == plVar6->sid) {
          lws_h2_goaway(wsi,1,"cant depend on own sid");
        }
        goto LAB_001230b8;
      }
      plVar6->dep = plVar6->dep << 8 | uVar18;
      break;
    case '\x03':
    case '\b':
      plVar6->hpack_e_dep = plVar6->hpack_e_dep << 8 | uVar18;
      break;
    case '\x04':
      iVar11 = (int)(uVar17 - plVar6->preamble) % 6;
      plVar6->one_setting[iVar11] = bVar9;
      if (iVar11 == 5) {
        lws_h2_settings(wsi,&plVar6->peer_set,plVar6->one_setting,6);
        uVar25 = in_stack_ffffffffffffff58;
      }
      break;
    case '\x05':
      break;
    case '\x06':
      if ((bVar3 & 1) == 0) {
        if (8 < uVar10) {
          return 1;
        }
        plVar6->ping_payload[uVar17] = bVar9;
      }
      break;
    case '\a':
      uVar17 = plVar6->inside;
      plVar6->inside = uVar17 + 1;
      if (uVar17 - 4 < 4) {
        plVar6->goaway_err = plVar6->goaway_err << 8 | uVar18;
      }
      else if (uVar17 < 4) {
        plVar6->goaway_last_sid = plVar6->goaway_last_sid << 8 | uVar18;
        plVar6->goaway_str[0] = '\0';
      }
      else {
        if (uVar17 - 8 < 0x1f) {
          plVar6->goaway_str[uVar17 - 8] = bVar9;
        }
        plVar6->goaway_str[0x1f] = '\0';
      }
      break;
    default:
      _lws_log(4,"%s: unhandled frame type %d\n","lws_h2_parser");
      goto LAB_001243b3;
    }
switchD_001232ea_caseD_5:
    in_stack_ffffffffffffff58 = uVar25;
LAB_001230b8:
    uVar18 = plVar6->count;
    uVar17 = plVar6->length;
    pbVar21 = pbVar23;
    if (uVar17 < uVar18) {
      _lws_log(4,"%s: count > length %u %u (type %d)\n","lws_h2_parser",(ulong)uVar18,(ulong)uVar17,
               (ulong)plVar6->type);
      goto LAB_00123275;
    }
    if (uVar18 != uVar17) goto LAB_00122faf;
LAB_00123275:
    iVar11 = lws_h2_parse_end_of_frame(wsi);
    if (iVar11 == 0) goto LAB_00122faf;
    if (iVar11 == 2) {
      iVar11 = 2;
    }
    else {
LAB_001243b3:
      iVar11 = 1;
    }
    goto LAB_001243c0;
  }
  pbVar21 = pbVar23;
  if (8 < bVar3) goto LAB_00122faf;
  plVar6->frame_state = bVar3 + 1;
  switch(bVar3) {
  case 0:
    plVar6->field_0xa8 = plVar6->field_0xa8 & 0x3f;
    plVar6->padding = '\0';
    plVar6->preamble = 0;
    plVar6->length = uVar18;
    plVar6->inside = 0;
    goto LAB_00122faf;
  case 1:
  case 2:
    plVar6->length = plVar6->length << 8 | uVar18;
    goto LAB_00122faf;
  case 3:
    plVar6->type = bVar9;
    goto LAB_00122faf;
  case 4:
    plVar6->flags = bVar9;
    goto LAB_00122faf;
  }
  plVar6->sid = plVar6->sid << 8 | uVar18;
  if ((byte)(bVar3 + 1) != '\t') goto LAB_00122faf;
  plVar7 = (wsi->h2).h2n;
  plVar7->count = 0;
  plVar7->swsi = wsi;
  uVar18 = plVar7->sid;
  uVar17 = uVar18 & 0x7fffffff;
  plVar7->sid = uVar17;
  if ((uVar18 & 1) == 0 && uVar17 != 0) {
    pcVar12 = local_58;
    lws_snprintf(pcVar12,0x20,"Even Stream ID 0x%x");
    uVar19 = 1;
LAB_0012318f:
    lws_h2_goaway(wsi,uVar19,pcVar12);
    goto LAB_00122faf;
  }
  if (wsi->immortal_substream_count == '\0') {
    iVar11 = ((wsi->a).vhost)->keepalive_timeout;
    if (iVar11 == 0) {
      iVar11 = 0x1f;
    }
    lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar11);
    uVar17 = plVar7->sid;
  }
  if (uVar17 != 0) {
    plVar14 = lws_wsi_mux_from_id(wsi,uVar17);
    plVar7->swsi = plVar14;
  }
  pcVar12 = lws_wsi_tag(wsi);
  pcVar15 = lws_wsi_tag(plVar7->swsi);
  uVar19 = plVar7->length;
  in_stack_ffffffffffffff58 = CONCAT44(uVar26,plVar7->sid);
  _lws_log(0x10,"%s (%s): fr hdr: typ 0x%x, fla 0x%x, sid 0x%x, len 0x%x\n",pcVar12,pcVar15,
           (ulong)plVar7->type,(ulong)plVar7->flags,in_stack_ffffffffffffff58,uVar19);
  if (((plVar7->field_0xa8 & 0x20) == 0) || (plVar7->sid <= plVar7->highest_sid)) {
    bVar9 = plVar7->type;
    if (9 < bVar9) goto LAB_0012347a;
  }
  else {
    plVar7->type = '\n';
    bVar9 = 10;
LAB_0012347a:
    _lws_log(8,"%s: ignoring unknown frame type %d (len %d)\n","lws_h2_parse_frame_header",
             (ulong)bVar9,(ulong)plVar7->length);
    plVar7->type = '\n';
    bVar9 = 10;
  }
  iVar11 = 8;
  if ((plVar7->our_set).s[5] < plVar7->length) {
    _lws_log(8,"%s: received oversize frame %d\n","lws_h2_parse_frame_header");
    lws_h2_goaway(wsi,6,"Peer ignored our frame size setting");
    goto LAB_001243b3;
  }
  if (plVar7->swsi == (lws *)0x0) {
    if (bVar9 == 0) {
      if ((plVar7->highest_sid_opened < plVar7->sid) || ((wsi->field_0x475 & 4) == 0)) {
        _lws_log(8,"%s: received %d bytes data for unknown sid %d, highest known %d\n",
                 "lws_h2_parse_frame_header");
        goto LAB_00123996;
      }
      _lws_log(4,"ignoring straggling data fl 0x%x\n",(ulong)plVar7->flags);
      plVar7->type = '\n';
      plVar14 = plVar7->swsi;
      if (plVar7->highest_sid_opened < plVar7->sid) goto LAB_0012396b;
      goto LAB_00123504;
    }
    if (2 < bVar9 && plVar7->highest_sid_opened < plVar7->sid) {
      plVar14 = (lws *)0x0;
LAB_0012396b:
      pcVar12 = lws_wsi_tag(plVar14);
      _lws_log(8,"%s: %s, No child for sid %d, rxcmd %d\n","lws_h2_parse_frame_header",pcVar12,
               (ulong)plVar7->sid,(ulong)plVar7->type,in_stack_ffffffffffffff58,uVar19);
LAB_00123996:
      uVar19 = 5;
      pcVar12 = "Data for nonexistent sid";
      goto LAB_0012318f;
    }
LAB_00123572:
    bVar9 = plVar7->type;
    bVar24 = true;
    plVar14 = (lws *)0x0;
  }
  else {
    pcVar12 = lws_wsi_tag(plVar7->swsi);
    _lws_log(8,"%s: %s, State: %s, received cmd %d\n","lws_h2_parse_frame_header",pcVar12,
             h2_state_names[(plVar7->swsi->h2).h2_state],(ulong)plVar7->type,
             in_stack_ffffffffffffff58,uVar19);
    plVar14 = plVar7->swsi;
LAB_00123504:
    uVar26 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    if (plVar14 == (lws *)0x0) goto LAB_00123572;
    bVar9 = plVar7->type;
    if (plVar7->sid != 0) {
      if (bVar9 == 10) {
        bVar9 = 10;
      }
      else if ((http2_rx_validity[(plVar14->h2).h2_state] >> (bVar9 & 0x1f) & 1) == 0) {
        pcVar12 = lws_wsi_tag(plVar14);
        bVar9 = (plVar7->swsi->h2).h2_state;
        in_stack_ffffffffffffff58 = CONCAT44(uVar26,(uint)http2_rx_validity[bVar9]);
        _lws_log(8,"%s: %s, State: %s, ILLEGAL cmdrx %d (OK 0x%x)\n","lws_h2_parse_frame_header",
                 pcVar12,h2_state_names[bVar9],(ulong)plVar7->type,in_stack_ffffffffffffff58);
        uVar19 = (uint)(((plVar7->swsi->h2).h2_state & 0xfd) == 4) * 4 + 1;
        pcVar12 = "invalid rx for state";
        goto LAB_0012318f;
      }
    }
    bVar24 = false;
  }
  if ((*(ushort *)&plVar7->field_0xa8 & 8) != 0) {
    if (bVar9 == 10) goto switchD_0012387f_caseD_a;
    uVar18 = plVar7->cont_exp_sid;
    uVar17 = uVar18;
    if (bVar9 != 9 || uVar18 != plVar7->sid) {
      _lws_log(8,"%s: expected cont on sid %u (got %d on sid %u)\n","lws_h2_parse_frame_header",
               (ulong)uVar18);
      uVar5 = *(ushort *)&plVar7->field_0xa8;
      *(ushort *)&plVar7->field_0xa8 = uVar5 & 0xfff7;
      uVar19 = ((uVar5 & 0x10) >> 1) + 1;
      pcVar12 = "Continuation hdrs State";
      goto LAB_0012318f;
    }
LAB_00123d35:
    _lws_log(8,"LWS_H2_FRAME_TYPE_CONTINUATION: sid = %u %d %d\n",(ulong)uVar17,
             (ulong)(*(ushort *)&plVar7->field_0xa8 >> 3 & 1),(ulong)uVar18);
    if ((((plVar7->field_0xa8 & 8) == 0) ||
        (plVar7->sid == 0 || plVar7->cont_exp_sid != plVar7->sid)) ||
       (plVar14 = plVar7->swsi, plVar14 == (lws *)0x0)) {
      uVar19 = 1;
      pcVar12 = "unexpected CONTINUATION";
    }
    else {
      if (((plVar14->h2).field_0x11 & 2) == 0) goto LAB_0012414d;
      uVar19 = 1;
      pcVar12 = "END_HEADERS already seen";
    }
    goto LAB_0012429e;
  }
  switch((ulong)bVar9) {
  case 0:
    _lws_log(8,"seen incoming LWS_H2_FRAME_TYPE_DATA start\n");
    if (plVar7->sid == 0) {
      _lws_log(8,"DATA: 0 sid\n");
      uVar19 = 1;
      pcVar12 = "DATA 0 sid";
      goto LAB_0012429e;
    }
    _lws_log(8,"Frame header DATA: sid %u, flags 0x%x, len %u\n",(ulong)plVar7->sid,
             (ulong)plVar7->flags,(ulong)plVar7->length);
    if (plVar7->swsi == (lws *)0x0) {
      iVar11 = 4;
      pcVar12 = "DATA: NULL swsi\n";
      goto LAB_00124284;
    }
    _lws_log(8,"DATA rx on state %d\n",(ulong)(plVar7->swsi->h2).h2_state);
    if (((plVar7->swsi->h2).h2_state | 2) == 6) {
      uVar19 = 5;
      pcVar12 = "conn closed";
      goto LAB_0012429e;
    }
    if (plVar7->length != 0) goto LAB_00122faf;
LAB_001242ba:
    lws_h2_parse_end_of_frame(wsi);
    break;
  case 1:
    _lws_log(8,"HEADERS: frame header: sid = %u\n",(ulong)plVar7->sid);
    uVar18 = plVar7->sid;
    if (uVar18 == 0) {
      pcVar12 = "sid 0";
LAB_001244a8:
      iVar11 = 1;
      lws_h2_goaway(wsi,1,pcVar12);
      goto LAB_001243c0;
    }
    plVar14 = plVar7->swsi;
    if (plVar14 == (lws *)0x0) {
      if ((wsi->field_0x475 & 4) == 0) {
        if ((wsi->mux).child_count + 1 <= (((wsi->h2).h2n)->our_set).s[3]) {
          plVar14 = __lws_wsi_server_new((wsi->a).vhost,wsi,uVar18);
          plVar7->swsi = plVar14;
          if (plVar14 == (lws *)0x0) {
            pcVar12 = "OOM";
            goto LAB_001244a8;
          }
          if (plVar7->highest_sid <= plVar7->sid) {
            plVar7->highest_sid = plVar7->sid + 2;
          }
          puVar2 = &(plVar14->h2).field_0x11;
          *puVar2 = *puVar2 | 0x10;
          iVar11 = lws_h2_update_peer_txcredit(plVar7->swsi,(plVar7->swsi->mux).my_sid,0x40000);
          if (iVar11 == 0) {
            plVar14 = plVar7->swsi;
            goto LAB_00124050;
          }
          goto LAB_001243b3;
        }
        pcVar12 = "Another stream not allowed";
        goto LAB_001244a8;
      }
LAB_001240b8:
      plVar14 = lws_wsi_mux_from_id(wsi,uVar18);
      plVar7->swsi = plVar14;
      pcVar12 = lws_wsi_tag(wsi);
      uVar18 = plVar7->sid;
      pcVar15 = lws_wsi_tag(plVar7->swsi);
      _lws_log(8,"HEADERS: nwsi %s: sid %u mapped to wsi %s\n",pcVar12,(ulong)uVar18,pcVar15);
      plVar14 = plVar7->swsi;
      if (plVar14 == (lws *)0x0) break;
    }
    else {
      if ((((plVar14->h2).field_0x11 & 3) == 2) && ((plVar7->flags & 1) == 0)) {
        pcVar12 = "extra HEADERS together";
        goto LAB_001244a8;
      }
      if ((wsi->field_0x475 & 4) != 0) goto LAB_001240b8;
LAB_00124050:
      if (((plVar14->http).ah == (allocated_headers *)0x0) &&
         (iVar11 = lws_header_table_attach(plVar14,0), iVar11 != 0)) {
        iVar11 = 1;
        _lws_log(1,"%s: Failed to get ah\n","lws_h2_parse_frame_header");
        goto LAB_001243c0;
      }
      plVar14 = (wsi->mux).child_list;
      while (plVar14 != (lws *)0x0) {
        if (((plVar14->mux).my_sid < plVar7->sid) && ((plVar14->h2).h2_state == '\0')) {
          lws_close_free_wsi(plVar14,LWS_CLOSE_STATUS_NOSTATUS,"h2 sid close");
        }
        plVar8 = (plVar14->mux).sibling_list;
        bVar24 = plVar8 == plVar14;
        plVar14 = plVar8;
        if (bVar24) {
          __assert_fail("w->mux.sibling_list != w",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/h2/http2.c"
                        ,0x539,"int lws_h2_parse_frame_header(struct lws *)");
        }
      }
      uVar26._0_1_ = plVar7->flags;
      uVar26._1_1_ = plVar7->padding;
      uVar26._2_1_ = plVar7->weight_temp;
      uVar26._3_1_ = plVar7->huff_pad;
      plVar7->cont_exp_sid = plVar7->sid;
      *(ushort *)&plVar7->field_0xa8 =
           ((ushort)*(undefined4 *)&plVar7->field_0xa8 & 0xffe7) + (~(ushort)uVar26 & 4) * 2 + 0x10;
      plVar14 = plVar7->swsi;
    }
LAB_0012414d:
    if ((((plVar14->a).vhost)->options & 0x100000000) == 0) {
      (plVar14->h2).field_0x11 = (plVar14->h2).field_0x11 & 0xfe | plVar7->flags & 1;
      _lws_log(0x10,"%s: hdr END_STREAM = %d\n","lws_h2_parse_frame_header",
               (ulong)((byte)(plVar7->swsi->h2).field_0x11 & 1));
    }
    else {
      lws_mux_mark_immortal(plVar14);
      pcVar12 = lws_wsi_tag(plVar7->swsi);
      _lws_log(8,"%s: %s: h2 stream entering long poll\n","lws_h2_parse_frame_header",pcVar12);
    }
    (plVar7->swsi->h2).field_0x11 = (plVar7->swsi->h2).field_0x11 & 0xfd | plVar7->flags >> 1 & 2;
    pcVar12 = lws_wsi_tag(plVar7->swsi);
    _lws_log(8,"%s: %s: END_HEADERS %d\n","lws_h2_parse_frame_header",pcVar12,
             (ulong)((byte)(plVar7->swsi->h2).field_0x11 >> 1 & 1));
    bVar9 = (plVar7->swsi->h2).field_0x11;
    if ((bVar9 & 2) != 0) {
      plVar7->field_0xa8 = plVar7->field_0xa8 & 0xf7;
      bVar9 = (plVar7->swsi->h2).field_0x11;
    }
    _lws_log(0x10,"END_HEADERS %d\n",(ulong)(bVar9 >> 1 & 1));
    break;
  case 2:
    _lws_log(8,"LWS_H2_FRAME_TYPE_PRIORITY complete frame\n");
    if (plVar7->sid == 0) {
      uVar19 = 1;
      pcVar12 = "Priority has 0 sid";
      goto LAB_0012429e;
    }
    if (plVar7->length == 5) goto LAB_00122faf;
    uVar19 = 6;
    pcVar12 = "Priority has length other than 5";
    goto LAB_0012429e;
  case 3:
    if (plVar7->sid == 0) goto LAB_001243b3;
    if (bVar24) {
      if (plVar7->highest_sid_opened < plVar7->sid) {
        pcVar12 = "crazy sid on RST_STREAM";
        goto LAB_001244a8;
      }
    }
    else {
      if (plVar7->length != 4) {
        uVar19 = 6;
        pcVar12 = "RST_STREAM can only be length 4";
        goto LAB_0012429e;
      }
      lws_h2_state(plVar14,LWS_H2_STATE_CLOSED);
    }
    break;
  case 4:
    _lws_log(8,"LWS_H2_FRAME_TYPE_SETTINGS complete frame\n");
    if (plVar7->sid != 0) {
      uVar19 = 1;
      pcVar12 = "Settings has nonzero sid";
      goto LAB_0012429e;
    }
    if ((plVar7->flags & 1) != 0) {
      if (plVar7->length != 0) {
        uVar19 = 6;
        pcVar12 = "Settings with ACK not allowed payload";
        goto LAB_0012429e;
      }
      goto LAB_001242d7;
    }
    uVar19 = 6;
    if (plVar7->length % 6 != 0) {
      pcVar12 = "Settings length error";
      goto LAB_0012429e;
    }
    if (plVar7->type == '\n') goto LAB_00122faf;
    if (((*(ulong *)&wsi->field_0x46e & 4) != 0) &&
       (((*(ulong *)&wsi->field_0x46e & 0x40) == 0 || ((wsi->flags & 0x20U) == 0)))) {
      plVar13 = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
      if (plVar13 != (lws_h2_protocol_send *)0x0) {
        lws_pps_schedule(wsi,plVar13);
        wsi->field_0x46e = wsi->field_0x46e | 0x40;
        break;
      }
      goto LAB_001243b3;
    }
    break;
  case 5:
    _lws_log(8,"LWS_H2_FRAME_TYPE_PUSH_PROMISE complete frame\n");
    uVar19 = 1;
    pcVar12 = "Server only";
    goto LAB_0012429e;
  case 6:
    if (plVar7->sid == 0) {
      if (plVar7->length != 8) {
        uVar19 = 6;
        pcVar12 = "Ping payload can only be 8";
        goto LAB_0012429e;
      }
      goto LAB_00122faf;
    }
    uVar19 = 1;
    pcVar12 = "Ping has nonzero sid";
    goto LAB_0012429e;
  case 7:
    iVar11 = 0x10;
    pcVar12 = "LWS_H2_FRAME_TYPE_GOAWAY received\n";
LAB_00124284:
    _lws_log(iVar11,pcVar12);
    break;
  case 8:
    if (plVar7->length == 4) {
      pcVar12 = "LWS_H2_FRAME_TYPE_WINDOW_UPDATE\n";
      goto LAB_00124284;
    }
    uVar19 = 6;
    pcVar12 = "window update frame not 4";
LAB_0012429e:
    lws_h2_goaway(wsi,uVar19,pcVar12);
    break;
  case 9:
    uVar18 = plVar7->cont_exp_sid;
    uVar17 = plVar7->sid;
    goto LAB_00123d35;
  case 10:
switchD_0012387f_caseD_a:
    if (plVar7->length == 0) goto LAB_001242ba;
    _lws_log(0x10,"%s: going on to deal with unknown frame remaining len %d\n",
             "lws_h2_parse_frame_header");
    break;
  default:
    _lws_log(8,"%s: ILLEGAL FRAME TYPE %d\n","lws_h2_parse_frame_header",(ulong)bVar9);
    plVar7->type = '\n';
  }
  if (plVar7->length == 0) {
LAB_001242d7:
    plVar7->frame_state = '\0';
  }
  goto LAB_00122faf;
}

Assistant:

int
lws_h2_parser(struct lws *wsi, unsigned char *in, lws_filepos_t _inlen,
	      lws_filepos_t *inused)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;
	unsigned char c, *oldin = in, *iend = in + (size_t)_inlen;
	int n, m;

	if (!h2n)
		goto fail;

	while (in < iend) {

		c = *in++;

		switch (lwsi_state(wsi)) {
		case LRS_H2_AWAIT_PREFACE:
			if (preface[h2n->count++] != c)
				goto fail;

			if (preface[h2n->count])
				break;

			lwsl_info("http2: %s: established\n", lws_wsi_tag(wsi));
			lwsi_set_state(wsi, LRS_H2_AWAIT_SETTINGS);
			lws_validity_confirmed(wsi);
			h2n->count = 0;
			wsi->txc.tx_cr = 65535;

			/*
			 * we must send a settings frame -- empty one is OK...
			 * that must be the first thing sent by server
			 * and the peer must send a SETTINGS with ACK flag...
			 */
			pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
			if (!pps)
				goto fail;
			lws_pps_schedule(wsi, pps);
			break;

		case LRS_H2_WAITING_TO_SEND_HEADERS:
		case LRS_ESTABLISHED:
		case LRS_H2_AWAIT_SETTINGS:

			if (h2n->frame_state != LWS_H2_FRAME_HEADER_LENGTH)
				goto try_frame_start;

			/*
			 * post-header, preamble / payload / padding part
			 */
			h2n->count++;

			if (h2n->type == LWS_H2_FRAME_TYPE_COUNT) { /* IGNORING FRAME */
				//lwsl_debug("%s: consuming for ignored %u %u\n", __func__, (unsigned int)h2n->count, (unsigned int)h2n->length);
				goto frame_end;
			}


			if (h2n->flags & LWS_H2_FLAG_PADDED &&
			    !h2n->pad_length) {
				/*
				 * Get the padding count... actual padding is
				 * at the end of the frame.
				 */
				h2n->padding = c;
				h2n->pad_length = 1;
				h2n->preamble++;

				if (h2n->padding > h2n->length - 1)
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
						      "execssive padding");
				break; /* we consumed this */
			}

			if (h2n->flags & LWS_H2_FLAG_PRIORITY &&
			    !h2n->collected_priority) {
				/* going to be 5 preamble bytes */

				lwsl_debug("PRIORITY FLAG:  0x%x\n", c);

				if (h2n->preamble++ - h2n->pad_length < 4) {
					h2n->dep = ((h2n->dep) << 8) | c;
					break; /* we consumed this */
				}
				h2n->weight_temp = c;
				h2n->collected_priority = 1;
				lwsl_debug("PRI FL: dep 0x%x, weight 0x%02X\n",
					   (unsigned int)h2n->dep,
					   h2n->weight_temp);
				break; /* we consumed this */
			}
			if (h2n->padding && h2n->count >
			    (h2n->length - h2n->padding)) {
				if (c) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "nonzero padding");
					break;
				}
				goto frame_end;
			}

			/* applies to wsi->h2.swsi which may be wsi */
			switch(h2n->type) {

			case LWS_H2_FRAME_TYPE_SETTINGS:
				n = (int)(h2n->count - 1u - h2n->preamble) %
				     LWS_H2_SETTINGS_LEN;
				h2n->one_setting[n] = c;
				if (n != LWS_H2_SETTINGS_LEN - 1)
					break;
				lws_h2_settings(wsi, &h2n->peer_set,
						h2n->one_setting,
						LWS_H2_SETTINGS_LEN);
				break;

			case LWS_H2_FRAME_TYPE_CONTINUATION:
			case LWS_H2_FRAME_TYPE_HEADERS:
				if (!h2n->swsi)
					break;
				if (lws_hpack_interpret(h2n->swsi, c)) {
					lwsl_info("%s: hpack failed\n",
						  __func__);
					goto fail;
				}
				break;

			case LWS_H2_FRAME_TYPE_GOAWAY:
				switch (h2n->inside++) {
				case 0:
				case 1:
				case 2:
				case 3:
					h2n->goaway_last_sid <<= 8;
					h2n->goaway_last_sid |= c;
					h2n->goaway_str[0] = '\0';
					break;

				case 4:
				case 5:
				case 6:
				case 7:
					h2n->goaway_err <<= 8;
					h2n->goaway_err |= c;
					break;

				default:
					if (h2n->inside - 9 <
					    sizeof(h2n->goaway_str) - 1)
						h2n->goaway_str[
						           h2n->inside - 9] = (char)c;
					h2n->goaway_str[
					    sizeof(h2n->goaway_str) - 1] = '\0';
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_DATA:

			//	lwsl_info("%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n",
			//		  __func__, h2n->flags);

				/*
				 * let the network wsi live a bit longer if
				 * subs are active... our frame may take a long
				 * time to chew through
				 */
				if (!wsi->immortal_substream_count)
					lws_set_timeout(wsi,
					PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
						wsi->a.vhost->keepalive_timeout ?
					    wsi->a.vhost->keepalive_timeout : 31);

				if (!h2n->swsi)
					break;

				if (lws_buflist_next_segment_len(
						&h2n->swsi->buflist, NULL))
					lwsl_info("%s: substream has pending\n",
						  __func__);

				if (lwsi_role_http(h2n->swsi) &&
				    lwsi_state(h2n->swsi) == LRS_ESTABLISHED) {
					lwsi_set_state(h2n->swsi, LRS_BODY);
					lwsl_info("%s: %s to LRS_BODY\n",
							__func__, lws_wsi_tag(h2n->swsi));
				}

				if (lws_hdr_total_length(h2n->swsi,
					     WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
				    h2n->swsi->http.rx_content_length &&
				    h2n->swsi->http.rx_content_remain <
						    lws_ptr_diff_size_t(iend, in) + 1 - 9 && /* last */
				    h2n->inside < h2n->length) {

					lwsl_warn("%s: %lu %lu %lu %lu\n", __func__,
						  (unsigned long)h2n->swsi->http.rx_content_remain,
						(unsigned long)(lws_ptr_diff_size_t(iend, in) + 1 - 9),
						(unsigned long)h2n->inside, (unsigned long)h2n->length);

					/* unread data in frame */
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
					    "More rx than content_length told");
					break;
				}

				/*
				 * We operate on a frame.  The RX we have at
				 * hand may exceed the current frame.
				 */

				n = (int)lws_ptr_diff_size_t(iend, in)  + 1;
				if (n > (int)(h2n->length - h2n->count + 1)) {
					if (h2n->count > h2n->length)
						goto close_swsi_and_return;
					n = (int)(h2n->length - h2n->count) + 1;
					lwsl_debug("---- restricting len to %d "
						   "\n", n);
				}
#if defined(LWS_WITH_CLIENT)
				if (h2n->swsi->client_mux_substream) {
					if (!h2n->swsi->a.protocol) {
						lwsl_err("%s: %p doesn't have protocol\n",
							 __func__, lws_wsi_tag(h2n->swsi));
						m = 1;
					} else {
						h2n->swsi->txc.peer_tx_cr_est -= n;
						wsi->txc.peer_tx_cr_est -= n;
						lws_wsi_txc_describe(&h2n->swsi->txc,
							__func__,
							h2n->swsi->mux.my_sid);
					m = user_callback_handle_rxflow(
						h2n->swsi->a.protocol->callback,
						h2n->swsi,
					  LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
						h2n->swsi->user_space,
						in - 1, (unsigned int)n);
					}

					in += n - 1;
					h2n->inside += (unsigned int)n;
					h2n->count += (unsigned int)n - 1;

					if (m) {
						lwsl_info("RECEIVE_CLIENT_HTTP "
							  "closed it\n");
						goto close_swsi_and_return;
					}

					break;
				}
#endif

				if (lwsi_state(h2n->swsi) == LRS_DEFERRING_ACTION) {
					m = lws_buflist_append_segment(
						&h2n->swsi->buflist, in - 1, (unsigned int)n);
					if (m < 0)
						return -1;

					/*
					 * Since we're in an open-ended
					 * DEFERRING_ACTION, don't add this swsi
					 * to the pt list of wsi holding buflist
					 * content yet, we are not in a position
					 * to consume it until we get out of
					 * DEFERRING_ACTION.
					 */

					in += n - 1;
					h2n->inside += (unsigned int)n;
					h2n->count += (unsigned int)n - 1;

					lwsl_debug("%s: deferred %d\n", __func__, n);
					goto do_windows;
				}

				h2n->swsi->outer_will_close = 1;
				/*
				 * choose the length for this go so that we end at
				 * the frame boundary, in the case there is already
				 * more waiting leave it for next time around
				 */

				n = lws_read_h1(h2n->swsi, in - 1, (unsigned int)n);
				// lwsl_notice("%s: lws_read_h1 %d\n", __func__, n);
				h2n->swsi->outer_will_close = 0;
				/*
				 * can return 0 in POST body with
				 * content len exhausted somehow.
				 */
				if (n < 0 ||
				    (!n && h2n->swsi->http.content_length_given && !lws_buflist_next_segment_len(
						    &wsi->buflist, NULL))) {
					lwsl_info("%s: lws_read_h1 told %d %u / %u\n",
						__func__, n,
						(unsigned int)h2n->count,
						(unsigned int)h2n->length);
					in += h2n->length - h2n->count;
					h2n->inside = h2n->length;
					h2n->count = h2n->length - 1;

					//if (n < 0)
					//	goto already_closed_swsi;
					goto close_swsi_and_return;
				}

				lwsl_info("%s: lws_read_h1 telling %d %u / %u\n",
						__func__, n,
						(unsigned int)h2n->count,
						(unsigned int)h2n->length);

				in += (unsigned int)n - 1;
				h2n->inside += (unsigned int)n;
				h2n->count += (unsigned int)n - 1;

				h2n->swsi->txc.peer_tx_cr_est -= n;
				wsi->txc.peer_tx_cr_est -= n;

do_windows:

#if defined(LWS_WITH_CLIENT)
				if (!(h2n->swsi->flags & LCCSCF_H2_MANUAL_RXFLOW))
#endif
				{
					/*
					 * The default behaviour is we just keep
					 * cranking the other side's tx credit
					 * back up, for simple bulk transfer as
					 * fast as we can take it
					 */

					m = n; //(2 * h2n->length) + 65536;

					/* update both the stream and nwsi */

					lws_h2_update_peer_txcredit_thresh(h2n->swsi,
								    h2n->sid, m, m);
				}
#if defined(LWS_WITH_CLIENT)
				else {
					/*
					 * If he's handling it himself, only
					 * repair the nwsi credit but allow the
					 * stream credit to run down until the
					 * user code deals with it
					 */
					lws_h2_update_peer_txcredit(wsi, 0, n);
					h2n->swsi->txc.manual = 1;
				}
#endif
				break;

			case LWS_H2_FRAME_TYPE_PRIORITY:
				if (h2n->count <= 4) {
					h2n->dep <<= 8;
					h2n->dep |= c;
					break;
				}
				h2n->weight_temp = c;
				lwsl_info("PRIORITY: dep 0x%x, weight 0x%02X\n",
					  (unsigned int)h2n->dep, h2n->weight_temp);

				if ((h2n->dep & ~(1u << 31)) == h2n->sid) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "cant depend on own sid");
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_RST_STREAM:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_PUSH_PROMISE:
				break;

			case LWS_H2_FRAME_TYPE_PING:
				if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK) { // ack
				} else { /* they're sending us a ping request */
					if (h2n->count > 8)
						return 1;
					h2n->ping_payload[h2n->count - 1] = c;
				}
				break;

			case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
				//lwsl_debug("%s: consuming for ignored %u %u\n", __func__, (unsigned int)h2n->count, (unsigned int)h2n->length);
				h2n->count++;
				break;

			default:
				lwsl_notice("%s: unhandled frame type %d\n",
					    __func__, h2n->type);

				goto fail;
			}

frame_end:
			if (h2n->count > h2n->length) {
				lwsl_notice("%s: count > length %u %u (type %d)\n",
					    __func__, (unsigned int)h2n->count,
					    (unsigned int)h2n->length, h2n->type);

			} else
				if (h2n->count != h2n->length)
					break;

			/*
			 * end of frame just happened
			 */
			n = lws_h2_parse_end_of_frame(wsi);
			if (n == 2) {
				*inused = (lws_filepos_t)lws_ptr_diff_size_t(in, oldin);

				return 2;
			}
			if (n)
				goto fail;

			break;

try_frame_start:
			if (h2n->frame_state <= 8) {

				switch (h2n->frame_state++) {
				case 0:
					h2n->pad_length = 0;
					h2n->collected_priority = 0;
					h2n->padding = 0;
					h2n->preamble = 0;
					h2n->length = c;
					h2n->inside = 0;
					break;
				case 1:
				case 2:
					h2n->length <<= 8;
					h2n->length |= c;
					break;
				case 3:
					h2n->type = c;
					break;
				case 4:
					h2n->flags = c;
					break;

				case 5:
				case 6:
				case 7:
				case 8:
					h2n->sid <<= 8;
					h2n->sid |= c;
					break;
				}
			}

			if (h2n->frame_state == LWS_H2_FRAME_HEADER_LENGTH &&
			    lws_h2_parse_frame_header(wsi))
				goto fail;
			break;

		default:
			if (h2n->type == LWS_H2_FRAME_TYPE_COUNT) { /* IGNORING FRAME */
				//lwsl_debug("%s: consuming for ignored %u %u\n", __func__, (unsigned int)h2n->count, (unsigned int)h2n->length);
				h2n->count++;
			}
			break;
		}
	}

	*inused = (lws_filepos_t)lws_ptr_diff_size_t(in, oldin);

	return 0;

close_swsi_and_return:

	lws_close_free_wsi(h2n->swsi, 0, "close_swsi_and_return");
	h2n->swsi = NULL;
	h2n->frame_state = 0;
	h2n->count = 0;

// already_closed_swsi:
	*inused = (lws_filepos_t)lws_ptr_diff_size_t(in, oldin);

	return 2;

fail:
	*inused = (lws_filepos_t)lws_ptr_diff_size_t(in, oldin);

	return 1;
}

#if defined(LWS_WITH_CLIENT)
int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI), *simp;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	const char *path = "/";
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	unsigned int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	/*
	 * We MUST allocate our sid here at the point we're about to send the
	 * stream open.  It's because we don't know the order in which multiple
	 * open streams will send their headers... in h2, sending the headers
	 * is the point the stream is opened.  The peer requires that we only
	 * open streams in ascending sid order
	 */

	wsi->mux.my_sid = nwsi->h2.h2n->highest_sid_opened = sid;
	lwsl_info("%s: %s: assigning SID %d at header send\n", __func__,
			lws_wsi_tag(wsi), sid);


	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->a.context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	/* h2 pseudoheaders must be in a bunch at the start */

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;


	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI);
	if (n)
		path = uri;
	else
		if (wsi->stash && wsi->stash->cis[CIS_PATH]) {
			path = wsi->stash->cis[CIS_PATH];
			n = (int)strlen(path);
		} else
			n = 1;

	if (n > 1 && path[0] == '/' && path[1] == '/') {
		path++;
		n--;
	}

	if (n && lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)path, n, &p, end))
		goto fail_length;

	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST);
	simp = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_HOST);
	if (!n && wsi->stash && wsi->stash->cis[CIS_ADDRESS]) {
		n = (int)strlen(wsi->stash->cis[CIS_ADDRESS]);
		simp = wsi->stash->cis[CIS_ADDRESS];
	}

//	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN);
//	simp = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_ORIGIN);
#if 0
	if (n && simp && lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)simp, n, &p, end))
		goto fail_length;
#endif


	if (/*!wsi->client_h2_alpn && */n && simp &&
	    lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)simp, n, &p, end))
		goto fail_length;


	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

#if defined(LWS_WITH_CACHE_NSCOOKIEJAR) && defined(LWS_WITH_CLIENT)
	if (wsi->flags & LCCSCF_CACHE_COOKIES)
		lws_cookie_send_cookies(wsi, (char **)&p, (char *)end);
#endif

	if (wsi->a.protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, lws_ptr_diff_size_t(end, p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending  || lws_has_buffered_out(wsi)))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, lws_ptr_diff_size_t(p, start), (enum lws_write_protocol)m);

	if (n != lws_ptr_diff(p, start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, wsi->mux.my_sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}
#endif

#if defined(LWS_ROLE_WS) && defined(LWS_WITH_SERVER)
int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	size_t m;
	int n;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->a.protocol->name && wsi->a.protocol->name[0]) {

#if defined(LWS_WITH_SECURE_STREAMS) && defined(LWS_WITH_SERVER)

		/*
		 * This is the h2 version of server-ws.c understanding that it
		 * did the ws upgrade on a ss server object, therefore it needs
		 * to pass back to the peer the policy ws-protocol name, not
		 * the generic ss-ws.c protocol name
		 */

		if (wsi->a.vhost && wsi->a.vhost->ss_handle &&
		    wsi->a.vhost->ss_handle->policy->u.http.u.ws.subprotocol) {
			lws_ss_handle_t *h =
				(lws_ss_handle_t *)wsi->a.opaque_user_data;

			lwsl_notice("%s: Server SS %s .wsi %s switching to ws protocol\n",
					__func__, lws_ss_tag(h), lws_wsi_tag(h->wsi));

			wsi->a.protocol = &protocol_secstream_ws;

			/*
			 * inform the SS user code that this has done a one-way
			 * upgrade to some other protocol... it will likely
			 * want to treat subsequent payloads differently
			 */

			lws_ss_event_helper(h, LWSSSCS_SERVER_UPGRADE);

			lws_mux_mark_immortal(wsi);

			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->a.vhost->ss_handle->policy->
						u.http.u.ws.subprotocol,
				(int)strlen(wsi->a.vhost->ss_handle->policy->
						u.http.u.ws.subprotocol), &p, end))
					return -1;
		} else
#endif

			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->a.protocol->name,
				(int)strlen(wsi->a.protocol->name), &p, end))
					return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff_size_t(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != (int)m) {
		lwsl_err("_write returned %d from %d\n", n, (int)m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->a.protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}
#endif

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (size_t)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}